

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identification_strategy.cpp
# Opt level: O2

LCC_EVENT_TYPE __thiscall
license::hw_identifier::IdentificationStrategy::validate_identifier
          (IdentificationStrategy *this,HwIdentifier *identifier)

{
  bool bVar1;
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar2;
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar3;
  LCC_EVENT_TYPE LVar4;
  HwIdentifier *it;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  available_ids;
  
  LVar2 = HwIdentifier::get_identification_strategy(identifier);
  LVar3 = (*this->_vptr_IdentificationStrategy[2])(this);
  if (LVar2 == LVar3) {
    (*this->_vptr_IdentificationStrategy[4])(&available_ids,this);
    LVar4 = IDENTIFIERS_MISMATCH;
    do {
      if (available_ids.
          super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          available_ids.
          super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0018a356;
      bVar1 = operator==(available_ids.
                         super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                         ._M_impl.super__Vector_impl_data._M_start,identifier);
      available_ids.
      super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
      ._M_impl.super__Vector_impl_data._M_start =
           available_ids.
           super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
    } while (!bVar1);
    LVar4 = LICENSE_OK;
LAB_0018a356:
    std::
    vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    ::~vector(&available_ids);
  }
  else {
    LVar4 = IDENTIFIERS_MISMATCH;
  }
  return LVar4;
}

Assistant:

LCC_EVENT_TYPE IdentificationStrategy::validate_identifier(const HwIdentifier& identifier) const {
	LCC_EVENT_TYPE result = IDENTIFIERS_MISMATCH;

	if (identifier.get_identification_strategy() == identification_strategy()) {
		const vector<HwIdentifier> available_ids = alternative_ids();
		for (const auto& it : available_ids) {
			if (it == identifier) {
				result = LICENSE_OK;
				break;
			}
		}
	}
	return result;
}